

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::FromSha1(string *__return_storage_ptr__,cmUuid *this,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,string *name)

{
  SHA_CTX *context;
  reference data;
  size_type len;
  sha_byte asStack_78 [8];
  uchar digest [20];
  SHA_CTX *sha;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashInput;
  string *name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace_local;
  cmUuid *this_local;
  
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  CreateHashInput(this,uuidNamespace,
                  (string *)
                  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  context = (SHA_CTX *)operator_new(0xd0);
  cmSHA1_Init(context);
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  cmSHA1_Update(context,data,len);
  asStack_78[0] = '\0';
  asStack_78[1] = '\0';
  asStack_78[2] = '\0';
  asStack_78[3] = '\0';
  asStack_78[4] = '\0';
  asStack_78[5] = '\0';
  asStack_78[6] = '\0';
  asStack_78[7] = '\0';
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  cmSHA1_Final(asStack_78,context);
  if (context != (SHA_CTX *)0x0) {
    operator_delete(context,0xd0);
  }
  FromDigest_abi_cxx11_(__return_storage_ptr__,this,asStack_78,'\x05');
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromSha1(std::vector<unsigned char> const& uuidNamespace,
    std::string const& name) const
{
  std::vector<unsigned char> hashInput;
  this->CreateHashInput(uuidNamespace, name, hashInput);

  SHA_CTX *sha = new SHA_CTX;
  SHA1_Init(sha);
  SHA1_Update(sha, &hashInput[0], hashInput.size());

  unsigned char digest[SHA1_DIGEST_LENGTH] = {0};
  SHA1_Final(digest, sha);

  delete sha;

  return this->FromDigest(digest, 5);
}